

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char> __thiscall
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>
          (detail *this,basic_appender<char> out,unsigned___int128 value,uint prefix,
          format_specs *specs,digit_grouping<char> *grouping)

{
  undefined1 n [16];
  undefined1 value_00 [16];
  undefined1 n_00 [16];
  undefined1 value_01 [16];
  undefined1 n_01 [16];
  undefined1 value_02 [16];
  undefined1 n_02 [16];
  undefined1 value_03 [16];
  uint uVar1;
  uint uVar2;
  int num_digits;
  int iVar3;
  basic_appender<char> bVar4;
  bool upper;
  uint uVar5;
  undefined4 in_register_00000014;
  digit_grouping<char> *in_R9;
  ulong size;
  undefined1 auStack_278 [12];
  uint prefix_local;
  basic_appender<char> local_268;
  anon_class_24_3_e2c60416 local_260;
  memory_buffer buffer;
  
  uVar2 = (uint)specs;
  buffer.super_buffer<char>.ptr_ = buffer.store_;
  buffer.super_buffer<char>.size_ = 0;
  buffer.super_buffer<char>.grow_ =
       basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  buffer.super_buffer<char>.capacity_ = 500;
  uVar1 = *(uint *)&(grouping->grouping_)._M_dataplus._M_p;
  upper = SUB41(prefix,0);
  iVar3 = (int)out.container;
  prefix_local = uVar2;
  local_268.container = (buffer<char> *)this;
  switch(uVar1 & 7) {
  case 4:
    if ((uVar1 >> 0xd & 1) != 0) {
      uVar5 = (uint)((uVar1 >> 0xc & 1) == 0) << 0xd | 0x5830;
      uVar1 = uVar5 << 8;
      if (uVar2 == 0) {
        uVar1 = uVar5;
      }
      uVar2 = (uVar1 | uVar2) + 0x2000000;
    }
    n._12_4_ = uVar2;
    n._0_12_ = auStack_278;
    prefix_local = uVar2;
    num_digits = count_digits<4,unsigned__int128>((unsigned___int128)n);
    value_00._12_4_ = prefix_local;
    value_00._0_12_ = auStack_278;
    format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
              (4,&buffer.super_buffer<char>,(unsigned___int128)value_00,iVar3,upper);
    break;
  case 5:
    n_01._12_4_ = uVar2;
    n_01._0_12_ = auStack_278;
    num_digits = count_digits<3,unsigned__int128>((unsigned___int128)n_01);
    if (((((ulong)(grouping->grouping_)._M_dataplus._M_p & 0x2000) != 0) &&
        (*(int *)((long)&(grouping->grouping_)._M_string_length + 4) <= num_digits)) &&
       (out.container != (buffer<char> *)0x0 || CONCAT44(in_register_00000014,prefix) != 0)) {
      uVar1 = 0x3000;
      if (uVar2 == 0) {
        uVar1 = 0x30;
      }
      uVar2 = (uVar1 | uVar2) + 0x1000000;
      prefix_local = uVar2;
    }
    value_02._12_4_ = prefix_local;
    value_02._0_12_ = auStack_278;
    format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
              (3,&buffer.super_buffer<char>,(unsigned___int128)value_02,iVar3,upper);
    break;
  case 6:
    if ((uVar1 >> 0xd & 1) != 0) {
      uVar5 = (uint)((uVar1 >> 0xc & 1) == 0) << 0xd | 0x4230;
      uVar1 = uVar5 << 8;
      if (uVar2 == 0) {
        uVar1 = uVar5;
      }
      uVar2 = (uVar1 | uVar2) + 0x2000000;
    }
    n_00._12_4_ = uVar2;
    n_00._0_12_ = auStack_278;
    prefix_local = uVar2;
    num_digits = count_digits<1,unsigned__int128>((unsigned___int128)n_00);
    value_01._12_4_ = prefix_local;
    value_01._0_12_ = auStack_278;
    format_base2e<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
              (1,&buffer.super_buffer<char>,(unsigned___int128)value_01,iVar3,upper);
    break;
  case 7:
    bVar4 = write_char<char,fmt::v11::basic_appender<char>>
                      ((basic_appender<char>)this,(char)out.container,(format_specs *)grouping);
    goto LAB_00316ee6;
  default:
    n_02._12_4_ = uVar2;
    n_02._0_12_ = auStack_278;
    num_digits = count_digits_fallback<unsigned__int128>
                           ((detail *)out.container,(unsigned___int128)n_02);
    value_03._12_4_ = prefix_local;
    value_03._0_12_ = auStack_278;
    format_decimal<char,_unsigned___int128,_fmt::v11::basic_appender<char>,_0>
              ((detail *)&buffer,out,(unsigned___int128)value_03,prefix);
  }
  iVar3 = digit_grouping<char>::count_separators(in_R9,num_digits);
  size = (ulong)((uVar2 >> 0x18) + num_digits + iVar3);
  local_260.prefix = &prefix_local;
  local_260.buffer = &buffer;
  bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>(fmt::v11::basic_appender<char>,unsigned__int128,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    (local_268,(format_specs *)grouping,size,size,&local_260);
LAB_00316ee6:
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate(&buffer);
  return (basic_appender<char>)bVar4.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type()) {
  default: FMT_ASSERT(false, ""); FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_base2e<char>(4, appender(buffer), value, num_digits, specs.upper());
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt() && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_base2e<char>(3, appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_base2e<char>(1, appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}